

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiListClipper::Begin(ImGuiListClipper *this,int items_count,float items_height)

{
  ImGuiWindow *window;
  ImGuiContext *g;
  float items_height_local;
  int items_count_local;
  ImGuiListClipper *this_local;
  
  this->StartPosY = (GImGui->CurrentWindow->DC).CursorPos.y;
  this->ItemsHeight = items_height;
  this->ItemsCount = items_count;
  this->StepNo = 0;
  this->DisplayStart = -1;
  this->DisplayEnd = 0;
  return;
}

Assistant:

void ImGuiListClipper::Begin(int items_count, float items_height)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    StartPosY = window->DC.CursorPos.y;
    ItemsHeight = items_height;
    ItemsCount = items_count;
    StepNo = 0;
    DisplayStart = -1;
    DisplayEnd = 0;
}